

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O2

bool __thiscall
ON_OffsetSurface::GetBBox(ON_OffsetSurface *this,double *bbox_min,double *bbox_max,bool bGrowBox)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  uVar4 = 0;
  bVar2 = ON_SurfaceProxy::GetBBox(&this->super_ON_SurfaceProxy,bbox_min,bbox_max,false);
  if (bVar2) {
    uVar1 = (this->m_offset_function).m_offset_value.m_count;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    dVar5 = 0.0;
    for (; uVar3 * 0x28 - uVar4 != 0; uVar4 = uVar4 + 0x28) {
      dVar6 = ABS(*(double *)
                   ((long)&((this->m_offset_function).m_offset_value.m_a)->m_distance + uVar4));
      if (dVar6 <= dVar5) {
        dVar6 = dVar5;
      }
      dVar5 = dVar6;
    }
    dVar5 = dVar5 + dVar5;
    if (bbox_min != (double *)0x0) {
      *bbox_min = *bbox_min - dVar5;
      bbox_min[1] = bbox_min[1] - dVar5;
      bbox_min[2] = bbox_min[2] - dVar5;
    }
    if (bbox_max != (double *)0x0) {
      *bbox_max = dVar5 + *bbox_max;
      bbox_max[1] = dVar5 + bbox_max[1];
      bbox_max[2] = dVar5 + bbox_max[2];
    }
  }
  return bVar2;
}

Assistant:

bool ON_OffsetSurface::GetBBox(
       double* bbox_min,
       double* bbox_max,
       bool bGrowBox
       ) const
{
  bool rc = ON_SurfaceProxy::GetBBox(bbox_min,bbox_max);
  if ( rc )
  {
    double d, distance = 0.0;
    int i, count = m_offset_function.m_offset_value.Count();
    for ( i = 0; i < count; i++ )
    {
      d = fabs(m_offset_function.m_offset_value[i].m_distance);
      if ( distance < d)
        distance = d;
    }
    distance *= 2;
    if ( 0 != bbox_min )
    {
      bbox_min[0] -= distance;
      bbox_min[1] -= distance;
      bbox_min[2] -= distance;
    }
    if ( 0 != bbox_max )
    {
      bbox_max[0] += distance;
      bbox_max[1] += distance;
      bbox_max[2] += distance;
    }
  }
  return rc;
}